

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

void __thiscall QFileSystemEntry::findFileNameSeparators(QFileSystemEntry *this)

{
  int iVar1;
  char16_t cVar2;
  short sVar3;
  qsizetype qVar4;
  int *piVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  int stop;
  int lastDotInFileName;
  int firstDotInFileName;
  int lastSeparator;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar9;
  int local_18;
  QChar local_14;
  QChar local_12;
  QChar local_10;
  QChar local_e;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)((long)&in_RDI[2].d.d + 2) == -2) {
    resolveFilePath((QFileSystemEntry *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar9 = -1;
    iVar7 = -1;
    local_2c = (int)*(short *)&in_RDI[2].d.d;
    local_c = local_2c;
    if (local_2c < 0) {
      local_c = -1;
      local_2c = 0;
    }
    qVar4 = QString::size(in_RDI);
    local_30 = (int)qVar4;
    do {
      iVar1 = local_30;
      local_30 = iVar1 + -1;
      iVar8 = iVar7;
      iVar6 = iVar9;
      if (local_30 < local_2c) goto LAB_002bb213;
      local_e = QString::at(in_RDI,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      cVar2 = QChar::unicode(&local_e);
      iVar8 = local_30;
      iVar6 = local_30;
      if (cVar2 == L'.') goto LAB_002bb213;
      local_10 = QString::at(in_RDI,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      cVar2 = QChar::unicode(&local_10);
    } while (cVar2 != L'/');
    local_c = local_30;
    iVar8 = iVar7;
    iVar6 = iVar9;
LAB_002bb213:
    if (local_c != local_30) {
      for (local_30 = iVar1 + -2; local_2c <= local_30; local_30 = local_30 + -1) {
        local_12 = QString::at(in_RDI,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
        ;
        cVar2 = QChar::unicode(&local_12);
        iVar7 = local_30;
        if (cVar2 != L'.') {
          local_14 = QString::at(in_RDI,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                ));
          cVar2 = QChar::unicode(&local_14);
          iVar7 = iVar6;
          if (cVar2 == L'/') {
            local_c = local_30;
            break;
          }
        }
        iVar6 = iVar7;
      }
    }
    *(short *)&in_RDI[2].d.d = (short)local_c;
    iVar7 = iVar6;
    if (iVar6 == -1) {
      sVar3 = -1;
    }
    else {
      local_18 = 0;
      piVar5 = qMax<int>(&local_18,&local_c);
      sVar3 = (short)iVar6 - (short)*piVar5;
    }
    *(short *)((long)&in_RDI[2].d.d + 2) = sVar3;
    if (iVar8 == -1) {
      *(undefined2 *)((long)&in_RDI[2].d.d + 4) = 0xffff;
    }
    else if (iVar7 == iVar8) {
      *(undefined2 *)((long)&in_RDI[2].d.d + 4) = 0;
    }
    else {
      *(short *)((long)&in_RDI[2].d.d + 4) = (short)iVar8 - (short)iVar7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemEntry::findFileNameSeparators() const
{
    if (m_firstDotInFileName == Uninitialized) {
        resolveFilePath();
        int firstDotInFileName = -1;
        int lastDotInFileName = -1;
        int lastSeparator = m_lastSeparator;

        int stop;
        if (lastSeparator < 0) {
            lastSeparator = -1;
            stop = 0;
        } else {
            stop = lastSeparator;
        }

        int i = m_filePath.size() - 1;
        for (; i >= stop; --i) {
            if (m_filePath.at(i).unicode() == '.') {
                firstDotInFileName = lastDotInFileName = i;
                break;
            } else if (m_filePath.at(i).unicode() == '/') {
                lastSeparator = i;
                break;
            }
        }

        if (lastSeparator != i) {
            for (--i; i >= stop; --i) {
                if (m_filePath.at(i).unicode() == '.')
                    firstDotInFileName = i;
                else if (m_filePath.at(i).unicode() == '/') {
                    lastSeparator = i;
                    break;
                }
            }
        }
        m_lastSeparator = lastSeparator;
        m_firstDotInFileName = firstDotInFileName == -1 ? -1 : firstDotInFileName - qMax(0, lastSeparator);
        if (lastDotInFileName == -1)
            m_lastDotInFileName = -1;
        else if (firstDotInFileName == lastDotInFileName)
            m_lastDotInFileName = 0;
        else
            m_lastDotInFileName = lastDotInFileName - firstDotInFileName;
    }
}